

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bison.cpp
# Opt level: O0

int yyparse(CProgram **program)

{
  byte bVar1;
  short sVar2;
  YYSTYPE YVar3;
  YYSTYPE YVar4;
  YYSTYPE YVar5;
  YYSTYPE YVar6;
  int iVar7;
  size_t __n;
  yy_state_t *__dest;
  YYSTYPE *__dest_00;
  YYSTYPE *__dest_01;
  long lVar8;
  yysymbol_kind_t local_1718;
  yysymbol_kind_t local_1714;
  yysymbol_kind_t local_1710;
  byte local_1709;
  int local_1580;
  int local_157c;
  char *pcStack_1578;
  int yysyntax_error_status;
  char *yymsgp;
  yypcontext_t yyctx;
  int yyi;
  int yylhs;
  CIdExp *p_7;
  IExpression *p_6;
  IExpression *p_5;
  IExpression *p_4;
  IExpression *p_3;
  CType *p_2;
  CType *p_1;
  CType *p;
  long yynewbytes_2;
  long yynewbytes_1;
  long yynewbytes;
  yyalloc *yyptr;
  yy_state_t *yyss1;
  long yysize;
  size_t sStack_14c8;
  int yylen;
  long yymsg_alloc;
  char *yymsg;
  char yymsgbuf [128];
  YYLTYPE yyerror_range [3];
  int iStack_1400;
  int iStack_13fc;
  YYLTYPE yyloc;
  YYSTYPE yyval;
  int local_13e0;
  yysymbol_kind_t yytoken;
  int yyresult;
  int yyn;
  YYLTYPE *yylsp;
  YYLTYPE *yyls;
  YYLTYPE yylsa [200];
  YYSTYPE *yyvsp;
  YYSTYPE *yyvs;
  YYSTYPE yyvsa [200];
  yy_state_t *yyssp;
  yy_state_t *yyss;
  yy_state_t yyssa [200];
  long yystacksize;
  int yyerrstatus;
  yy_state_fast_t yystate;
  CProgram **program_local;
  
  yystacksize._4_4_ = 0;
  yystacksize._0_4_ = 0;
  yyssa[0xc0] = 200;
  yyssa[0xc1] = '\0';
  yyssa[0xc2] = '\0';
  yyssa[0xc3] = '\0';
  yyssa[0xc4] = '\0';
  yyssa[0xc5] = '\0';
  yyssa[0xc6] = '\0';
  yyssa[199] = '\0';
  yylsa[199]._8_8_ = &yyvs;
  _yyresult = (YYSTYPE *)&yyls;
  yymsg_alloc = (long)&yymsg;
  sStack_14c8 = 0x80;
  yychar = -2;
  yyls = (YYLTYPE *)CONCAT44(yylloc.first_column,yylloc.first_line);
  yylsa[0].first_line = yylloc.last_line;
  yylsa[0].first_column = yylloc.last_column;
  yyvsa[199].Program = (CProgram *)&yyss;
  yylsp = (YYLTYPE *)_yyresult;
  yyvsp = (YYSTYPE *)yylsa[199]._8_8_;
  yyssp = (yy_state_t *)yyvsa[199].Program;
  for (; *yyvsa[199].string = (char)yystacksize._4_4_,
      yyvsa[199].Program < (CProgram *)(yyssp + yyssa._192_8_ + -1);
      yyvsa[199].Program =
           (CProgram *)
           ((long)&((yyvsa[199].Program)->super_IWrapper).super_PositionedNode.super_INode.
                   _vptr_INode + 1)) {
LAB_001cbe09:
    if (yystacksize._4_4_ == 6) {
      local_13e0 = 0;
      goto LAB_001cdd4a;
    }
    sVar2 = yypact[(int)yystacksize._4_4_];
    if (sVar2 == -0x76) {
LAB_001cbfe8:
      yytoken = (yysymbol_kind_t)""[(int)yystacksize._4_4_];
      if (yytoken == YYSYMBOL_YYEOF) {
        if (yychar == -2) {
          local_1710 = YYSYMBOL_YYEMPTY;
        }
        else {
          if ((yychar < 0) || (299 < yychar)) {
            local_1714 = YYSYMBOL_YYUNDEF;
          }
          else {
            local_1714 = (yysymbol_kind_t)""[yychar];
          }
          local_1710 = local_1714;
        }
        if ((int)yystacksize == 0) {
          yynerrs = yynerrs + 1;
          yymsgp = yyvsa[199].string;
          yyctx.yyssp._0_4_ = local_1710;
          yyctx._8_8_ = &yylloc;
          pcStack_1578 = "syntax error";
          local_157c = yysyntax_error((long *)&stack0xffffffffffffeb38,(char **)&yymsg_alloc,
                                      (yypcontext_t *)&yymsgp);
          if (local_157c == 0) {
            pcStack_1578 = (char *)yymsg_alloc;
          }
          else if (local_157c == -1) {
            if ((char **)yymsg_alloc != &yymsg) {
              free((void *)yymsg_alloc);
            }
            yymsg_alloc = (long)malloc(sStack_14c8);
            if ((void *)yymsg_alloc == (void *)0x0) {
              yymsg_alloc = (long)&yymsg;
              sStack_14c8 = 0x80;
              local_157c = -2;
            }
            else {
              local_157c = yysyntax_error((long *)&stack0xffffffffffffeb38,(char **)&yymsg_alloc,
                                          (yypcontext_t *)&yymsgp);
              pcStack_1578 = (char *)yymsg_alloc;
            }
          }
          yyerror(program,pcStack_1578);
          if (local_157c == -2) goto LAB_001cdd30;
        }
        yyerror_range[0].last_column = yylloc.first_column;
        yyerror_range[0].last_line = yylloc.first_line;
        if ((int)yystacksize == 3) {
          if (yychar < 1) {
            if (yychar == 0) goto LAB_001cdd24;
          }
          else {
            yydestruct("Error: discarding",local_1710,&yylval,&yylloc,program);
            yychar = -2;
          }
        }
LAB_001cdb4b:
        yystacksize._0_4_ = 3;
        while (((yypact[(int)yystacksize._4_4_] == -0x76 ||
                (iVar7 = yypact[(int)yystacksize._4_4_] + 1, iVar7 < 0)) ||
               ((0x144 < iVar7 || ((yycheck[iVar7] != 1 || (bVar1 = yytable[iVar7], bVar1 == 0))))))
              ) {
          if (yyvsa[199].Program == (CProgram *)yyssp) goto LAB_001cdd24;
          yyerror_range[0]._8_8_ = *_yyresult;
          yydestruct("Error: popping",(int)""[(int)yystacksize._4_4_],(YYSTYPE *)yylsa[199]._8_8_,
                     (YYLTYPE *)_yyresult,program);
          yylsa[199]._8_8_ = yylsa[199]._8_8_ + -8;
          yyvsa[199] = (YYSTYPE)((long)&yyvsa[199].Program[-1].classList._M_t.
                                        super___uniq_ptr_impl<CClassList,_std::default_delete<CClassList>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_CClassList_*,_std::default_delete<CClassList>_>
                                        .super__Head_base<0UL,_CClassList_*,_false>._M_head_impl + 7
                                );
          _yyresult = _yyresult + -2;
          yystacksize._4_4_ = (uint)(byte)*yyvsa[199].string;
        }
        *(YYSTYPE *)(yylsa[199]._8_8_ + 8) = yylval;
        yylsa[199]._8_8_ = yylsa[199]._8_8_ + 8;
        *(int *)(_yyresult + 2) = yyerror_range[0].last_line;
        *(int *)((long)_yyresult + 0x14) = yyerror_range[0].last_column;
        *(int *)(_yyresult + 3) = yylloc.last_line;
        *(int *)((long)_yyresult + 0x1c) = yylloc.last_column;
        _yyresult = _yyresult + 2;
        yystacksize._4_4_ = (uint)bVar1;
      }
      else {
LAB_001cc00d:
        iVar7 = (int)""[yytoken];
        yyloc._8_8_ = *(undefined8 *)(yylsa[199]._8_8_ + (long)(1 - iVar7) * 8);
        if (iVar7 == 0) {
          iStack_1400 = *(int *)(_yyresult + 1);
          iStack_13fc = *(int *)((long)_yyresult + 0xc);
          yyloc.first_line = iStack_1400;
          yyloc.first_column = iStack_13fc;
        }
        else {
          iStack_1400 = *(int *)(_yyresult + (long)iVar7 * -2 + 2);
          iStack_13fc = *(int *)((long)_yyresult + (long)iVar7 * -0x10 + 0x14);
          yyloc.first_line = *(int *)(_yyresult + (long)iVar7 * -2 + (long)iVar7 * 2 + 1);
          yyloc.first_column =
               *(int *)((long)_yyresult + (long)iVar7 * 0x10 + (long)iVar7 * -0x10 + 0xc);
        }
        switch(yytoken) {
        case YYSYMBOL_YYUNDEF:
          yyloc._8_8_ = operator_new(0x28);
          CProgram::CProgram((CProgram *)yyloc._8_8_,*(CMainClass **)(yylsa[199]._8_8_ + -8),
                             *(CClassList **)yylsa[199]._8_8_);
          *program = (CProgram *)yyloc._8_8_;
          break;
        case YYSYMBOL_NEW:
          yyloc._8_8_ = operator_new(0x28);
          CMainClass::CMainClass
                    ((CMainClass *)yyloc._8_8_,*(CIdExp **)(yylsa[199]._8_8_ + -0x18),
                     *(CMainMethod **)(yylsa[199]._8_8_ + -8));
          break;
        case YYSYMBOL_CLASS:
          yyloc._8_8_ = operator_new(0x38);
          CMainMethod::CMainMethod
                    ((CMainMethod *)yyloc._8_8_,(CType *)0x0,*(CIdExp **)(yylsa[199]._8_8_ + -0x28),
                     *(CFieldList **)(yylsa[199]._8_8_ + -0x10),
                     *(CCompoundStm **)(yylsa[199]._8_8_ + -8));
          break;
        case YYSYMBOL_EXTENDS:
          yyloc._8_8_ = operator_new(0x30);
          CClassList::CClassList((CClassList *)yyloc._8_8_);
          break;
        case YYSYMBOL_THIS:
          yyloc._8_8_ = *(undefined8 *)(yylsa[199]._8_8_ + -8);
          CClassList::Add(*(CClassList **)(yylsa[199]._8_8_ + -8),*(CClass **)yylsa[199]._8_8_);
          break;
        case YYSYMBOL_RETURN:
          yyloc._8_8_ = operator_new(0x38);
          CClass::CClass((CClass *)yyloc._8_8_,*(CIdExp **)(yylsa[199]._8_8_ + -0x20),(CIdExp *)0x0,
                         *(CFieldList **)(yylsa[199]._8_8_ + -0x10),
                         *(CMethodList **)(yylsa[199]._8_8_ + -8));
          break;
        case YYSYMBOL_PUBLIC:
          yyloc._8_8_ = operator_new(0x38);
          CClass::CClass((CClass *)yyloc._8_8_,*(CIdExp **)(yylsa[199]._8_8_ + -0x30),
                         *(CIdExp **)(yylsa[199]._8_8_ + -0x20),
                         *(CFieldList **)(yylsa[199]._8_8_ + -0x10),
                         *(CMethodList **)(yylsa[199]._8_8_ + -8));
          break;
        case YYSYMBOL_PRIVATE:
          yyloc._8_8_ = operator_new(0x50);
          CMethod::CMethod((CMethod *)yyloc._8_8_,*(CType **)(yylsa[199]._8_8_ + -0x58),
                           *(IExpression **)(yylsa[199]._8_8_ + -0x10),
                           *(CIdExp **)(yylsa[199]._8_8_ + -0x50),
                           *(CArgumentList **)(yylsa[199]._8_8_ + -0x40),
                           *(CFieldList **)(yylsa[199]._8_8_ + -0x28),
                           *(CCompoundStm **)(yylsa[199]._8_8_ + -0x20),true);
          break;
        case YYSYMBOL_STATIC:
          yyloc._8_8_ = operator_new(0x50);
          CMethod::CMethod((CMethod *)yyloc._8_8_,*(CType **)(yylsa[199]._8_8_ + -0x58),
                           *(IExpression **)(yylsa[199]._8_8_ + -0x10),
                           *(CIdExp **)(yylsa[199]._8_8_ + -0x50),
                           *(CArgumentList **)(yylsa[199]._8_8_ + -0x40),
                           *(CFieldList **)(yylsa[199]._8_8_ + -0x28),
                           *(CCompoundStm **)(yylsa[199]._8_8_ + -0x20),false);
          break;
        case YYSYMBOL_PRINTLN:
          yyloc._8_8_ = operator_new(0x30);
          CMethodList::CMethodList((CMethodList *)yyloc._8_8_);
          break;
        case YYSYMBOL_INT:
          yyloc._8_8_ = *(undefined8 *)(yylsa[199]._8_8_ + -8);
          CMethodList::Add(*(CMethodList **)(yylsa[199]._8_8_ + -8),*(CMethod **)yylsa[199]._8_8_);
          break;
        case YYSYMBOL_BOOLEAN:
          *(undefined1 *)(*(long *)(yylsa[199]._8_8_ + -8) + 0x38) = 1;
          yyloc._8_8_ = operator_new(0x28);
          CField::CField((CField *)yyloc._8_8_,*(CType **)(yylsa[199]._8_8_ + -0x10),
                         *(CIdExp **)(yylsa[199]._8_8_ + -8));
          break;
        case YYSYMBOL_VOID:
          yyloc._8_8_ = operator_new(0x30);
          CFieldList::CFieldList((CFieldList *)yyloc._8_8_);
          break;
        case YYSYMBOL_INT_ARRAY:
          yyloc._8_8_ = *(undefined8 *)(yylsa[199]._8_8_ + -8);
          CFieldList::Add(*(CFieldList **)(yylsa[199]._8_8_ + -8),*(CField **)yylsa[199]._8_8_);
          break;
        case YYSYMBOL_LENGTH:
          *(undefined1 *)(*(long *)yylsa[199]._8_8_ + 0x38) = 1;
          yyloc._8_8_ = operator_new(0x28);
          CArgument::CArgument
                    ((CArgument *)yyloc._8_8_,*(CType **)(yylsa[199]._8_8_ + -8),
                     *(CIdExp **)yylsa[199]._8_8_);
          break;
        case YYSYMBOL_TRUE:
          yyloc._8_8_ = operator_new(0x28);
          CType::CType((CType *)yyloc._8_8_,INT_ARRAY);
          (((CType *)yyloc._8_8_)->super_IWrapper).super_PositionedNode.position.firstLine =
               yylloc.first_line;
          (((CType *)yyloc._8_8_)->super_IWrapper).super_PositionedNode.position.firstColumn =
               yylloc.first_column;
          (((CType *)yyloc._8_8_)->super_IWrapper).super_PositionedNode.position.lastLine =
               yylloc.last_line;
          (((CType *)yyloc._8_8_)->super_IWrapper).super_PositionedNode.position.lastColumn =
               yylloc.last_column;
          break;
        case YYSYMBOL_FALSE:
          yyloc._8_8_ = operator_new(0x28);
          CType::CType((CType *)yyloc._8_8_,BOOLEAN);
          (((CType *)yyloc._8_8_)->super_IWrapper).super_PositionedNode.position.firstLine =
               yylloc.first_line;
          (((CType *)yyloc._8_8_)->super_IWrapper).super_PositionedNode.position.firstColumn =
               yylloc.first_column;
          (((CType *)yyloc._8_8_)->super_IWrapper).super_PositionedNode.position.lastLine =
               yylloc.last_line;
          (((CType *)yyloc._8_8_)->super_IWrapper).super_PositionedNode.position.lastColumn =
               yylloc.last_column;
          break;
        case YYSYMBOL_WHILE:
          yyloc._8_8_ = operator_new(0x28);
          CType::CType((CType *)yyloc._8_8_,INT);
          (((CType *)yyloc._8_8_)->super_IWrapper).super_PositionedNode.position.firstLine =
               yylloc.first_line;
          (((CType *)yyloc._8_8_)->super_IWrapper).super_PositionedNode.position.firstColumn =
               yylloc.first_column;
          (((CType *)yyloc._8_8_)->super_IWrapper).super_PositionedNode.position.lastLine =
               yylloc.last_line;
          (((CType *)yyloc._8_8_)->super_IWrapper).super_PositionedNode.position.lastColumn =
               yylloc.last_column;
          break;
        case YYSYMBOL_IF:
          yyloc._8_8_ = operator_new(0x28);
          CType::CType((CType *)yyloc._8_8_,*(CIdExp **)yylsa[199]._8_8_);
          break;
        case YYSYMBOL_ELSE:
          yyloc._8_8_ = operator_new(0x30);
          CArgumentList::CArgumentList((CArgumentList *)yyloc._8_8_,*(CArgument **)yylsa[199]._8_8_)
          ;
          break;
        case YYSYMBOL_NUM:
          yyloc._8_8_ = *(undefined8 *)(yylsa[199]._8_8_ + -0x10);
          CArgumentList::Add(*(CArgumentList **)(yylsa[199]._8_8_ + -0x10),
                             *(CArgument **)yylsa[199]._8_8_);
          break;
        case YYSYMBOL_ID:
          yyloc._8_8_ = operator_new(0x30);
          CArgumentList::CArgumentList((CArgumentList *)yyloc._8_8_);
          break;
        case YYSYMBOL_LPAREN:
          yyloc._8_8_ = *(undefined8 *)yylsa[199]._8_8_;
          break;
        case YYSYMBOL_RPAREN:
          yyloc._8_8_ = operator_new(0x28);
          CCompoundStm::CCompoundStm
                    ((CCompoundStm *)yyloc._8_8_,(IStatement *)0x0,(IStatement *)0x0);
          break;
        case YYSYMBOL_LBRACKET:
          yyloc._8_8_ = operator_new(0x28);
          CCompoundStm::CCompoundStm
                    ((CCompoundStm *)yyloc._8_8_,*(IStatement **)(yylsa[199]._8_8_ + -8),
                     *(IStatement **)yylsa[199]._8_8_);
          break;
        case YYSYMBOL_RBRACKET:
          yyloc._8_8_ = *(undefined8 *)(yylsa[199]._8_8_ + -8);
          break;
        case YYSYMBOL_LBRACE:
          yyloc._8_8_ = operator_new(0x30);
          CIfStm::CIfStm((CIfStm *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x20),
                         *(IStatement **)(yylsa[199]._8_8_ + -0x10),*(IStatement **)yylsa[199]._8_8_
                        );
          break;
        case YYSYMBOL_RBRACE:
          yyloc._8_8_ = operator_new(0x28);
          CWhileStm::CWhileStm
                    ((CWhileStm *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x10),
                     *(IStatement **)yylsa[199]._8_8_);
          break;
        case YYSYMBOL_COMMA:
          yyloc._8_8_ = operator_new(0x20);
          CPrintStm::CPrintStm((CPrintStm *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x10))
          ;
          break;
        case YYSYMBOL_DOT:
          *(undefined1 *)(*(long *)(yylsa[199]._8_8_ + -0x18) + 0x38) = 1;
          yyloc._8_8_ = operator_new(0x28);
          CAssignStm::CAssignStm
                    ((CAssignStm *)yyloc._8_8_,*(CIdExp **)(yylsa[199]._8_8_ + -0x18),
                     *(IExpression **)(yylsa[199]._8_8_ + -8));
          break;
        case YYSYMBOL_SEMI:
          *(undefined1 *)(*(long *)(yylsa[199]._8_8_ + -0x30) + 0x38) = 1;
          yyloc._8_8_ = operator_new(0x30);
          CAssignSubscriptStm::CAssignSubscriptStm
                    ((CAssignSubscriptStm *)yyloc._8_8_,*(CIdExp **)(yylsa[199]._8_8_ + -0x30),
                     *(IExpression **)(yylsa[199]._8_8_ + -0x20),
                     *(IExpression **)(yylsa[199]._8_8_ + -8));
          break;
        case YYSYMBOL_AND:
          yyloc._8_8_ = operator_new(0x30);
          COpExp::COpExp((COpExp *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x10),
                         *(IExpression **)yylsa[199]._8_8_,PLUS);
          break;
        case YYSYMBOL_OR:
          yyloc._8_8_ = operator_new(0x30);
          COpExp::COpExp((COpExp *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x10),
                         *(IExpression **)yylsa[199]._8_8_,MINUS);
          break;
        case YYSYMBOL_PLUS:
          yyloc._8_8_ = operator_new(0x30);
          COpExp::COpExp((COpExp *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x10),
                         *(IExpression **)yylsa[199]._8_8_,MULTIPLY);
          break;
        case YYSYMBOL_MINUS:
          yyloc._8_8_ = operator_new(0x30);
          CLogOpExp::CLogOpExp
                    ((CLogOpExp *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x10),
                     *(IExpression **)yylsa[199]._8_8_,AND);
          break;
        case YYSYMBOL_TIMES:
          yyloc._8_8_ = operator_new(0x30);
          CLogOpExp::CLogOpExp
                    ((CLogOpExp *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x10),
                     *(IExpression **)yylsa[199]._8_8_,OR);
          break;
        case YYSYMBOL_MOD:
          yyloc._8_8_ = operator_new(0x30);
          CCompExp::CCompExp((CCompExp *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x10),
                             *(IExpression **)yylsa[199]._8_8_,LESS);
          break;
        case YYSYMBOL_MAIN:
          yyloc._8_8_ = operator_new(0x30);
          CCompExp::CCompExp((CCompExp *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x10),
                             *(IExpression **)yylsa[199]._8_8_,GREATER);
          break;
        case YYSYMBOL_STRING:
          yyloc._8_8_ = operator_new(0x30);
          COpExp::COpExp((COpExp *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x10),
                         *(IExpression **)yylsa[199]._8_8_,MOD);
          break;
        case YYSYMBOL_LESS:
          yyloc._8_8_ = operator_new(0x28);
          CByIndexExpression::CByIndexExpression
                    ((CByIndexExpression *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x18),
                     *(IExpression **)(yylsa[199]._8_8_ + -8));
          break;
        case YYSYMBOL_GREATER:
          yyloc._8_8_ = operator_new(0x20);
          CGetLengthExp::CGetLengthExp
                    ((CGetLengthExp *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x10));
          break;
        case YYSYMBOL_NOT:
          yyloc._8_8_ = operator_new(0x30);
          CCallMethodExp::CCallMethodExp
                    ((CCallMethodExp *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -0x28),
                     *(CIdExp **)(yylsa[199]._8_8_ + -0x18),*(CExpList **)(yylsa[199]._8_8_ + -8));
          break;
        case YYSYMBOL_ASSIGN:
          *(undefined1 *)(*(long *)yylsa[199]._8_8_ + 0x38) = 1;
          yyloc._8_8_ = operator_new(0x20);
          CGetFieldByThisExpression::CGetFieldByThisExpression
                    ((CGetFieldByThisExpression *)yyloc._8_8_,*(CIdExp **)yylsa[199]._8_8_);
          break;
        case YYSYMBOL_YYACCEPT:
          yyloc._8_8_ = operator_new(0x20);
          CUnarMinusExp::CUnarMinusExp
                    ((CUnarMinusExp *)yyloc._8_8_,*(IExpression **)yylsa[199]._8_8_);
          break;
        case YYSYMBOL_Program:
          yyloc._8_8_ = operator_new(0x20);
          CNumExp::CNumExp((CNumExp *)yyloc._8_8_,*(char **)yylsa[199]._8_8_);
          (((CNumExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.firstLine =
               yylloc.first_line;
          (((CNumExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.firstColumn =
               yylloc.first_column;
          (((CNumExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.lastLine =
               yylloc.last_line;
          (((CNumExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.lastColumn =
               yylloc.last_column;
          break;
        case YYSYMBOL_MainClass:
          yyloc._8_8_ = operator_new(0x20);
          CLogExp::CLogExp((CLogExp *)yyloc._8_8_,true);
          (((CLogExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.firstLine =
               yylloc.first_line;
          (((CLogExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.firstColumn =
               yylloc.first_column;
          (((CLogExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.lastLine =
               yylloc.last_line;
          (((CLogExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.lastColumn =
               yylloc.last_column;
          break;
        case YYSYMBOL_MainMethod:
          yyloc._8_8_ = operator_new(0x20);
          CLogExp::CLogExp((CLogExp *)yyloc._8_8_,false);
          (((CLogExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.firstLine =
               yylloc.first_line;
          (((CLogExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.firstColumn =
               yylloc.first_column;
          (((CLogExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.lastLine =
               yylloc.last_line;
          (((CLogExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.lastColumn =
               yylloc.last_column;
          break;
        case YYSYMBOL_ClassDeclarationList:
          *(undefined1 *)(*(long *)yylsa[199]._8_8_ + 0x38) = 1;
          yyloc._8_8_ = *(undefined8 *)yylsa[199]._8_8_;
          break;
        case YYSYMBOL_Class:
          yyloc._8_8_ = operator_new(0x20);
          CNewArrayExpression::CNewArrayExpression
                    ((CNewArrayExpression *)yyloc._8_8_,*(IExpression **)(yylsa[199]._8_8_ + -8));
          break;
        case YYSYMBOL_MethodDeclaration:
          yyloc._8_8_ = operator_new(0x20);
          CNewIdentifier::CNewIdentifier
                    ((CNewIdentifier *)yyloc._8_8_,*(CIdExp **)(yylsa[199]._8_8_ + -0x10));
          break;
        case YYSYMBOL_MethodDeclarationList:
          yyloc._8_8_ = *(undefined8 *)(yylsa[199]._8_8_ + -8);
          break;
        case YYSYMBOL_VarDeclaration:
          yyloc._8_8_ = operator_new(0x18);
          CThisExpression::CThisExpression((CThisExpression *)yyloc._8_8_);
          (((CThisExpression *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.
          firstLine = yylloc.first_line;
          (((CThisExpression *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.
          firstColumn = yylloc.first_column;
          (((CThisExpression *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.
          lastLine = yylloc.last_line;
          (((CThisExpression *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.
          lastColumn = yylloc.last_column;
          break;
        case YYSYMBOL_VarDeclarationList:
          yyloc._8_8_ = operator_new(0x20);
          CNegativeExpression::CNegativeExpression
                    ((CNegativeExpression *)yyloc._8_8_,*(IExpression **)yylsa[199]._8_8_);
          break;
        case YYSYMBOL_Argument:
          yyloc._8_8_ = operator_new(0x30);
          CExpList::CExpList((CExpList *)yyloc._8_8_,*(IExpression **)yylsa[199]._8_8_);
          break;
        case YYSYMBOL_Type:
          yyloc._8_8_ = *(undefined8 *)(yylsa[199]._8_8_ + -0x10);
          CExpList::Add(*(CExpList **)(yylsa[199]._8_8_ + -0x10),*(IExpression **)yylsa[199]._8_8_);
          break;
        case YYSYMBOL_NonEmptyArgumentList:
          yyloc._8_8_ = operator_new(0x30);
          CExpList::CExpList((CExpList *)yyloc._8_8_);
          break;
        case YYSYMBOL_ArgumentList:
          yyloc._8_8_ = *(undefined8 *)yylsa[199]._8_8_;
          break;
        case YYSYMBOL_StatementList:
          yyloc._8_8_ = operator_new(0x40);
          CIdExp::CIdExp((CIdExp *)yyloc._8_8_,*(char **)yylsa[199]._8_8_);
          (((CIdExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.firstLine =
               yylloc.first_line;
          (((CIdExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.firstColumn =
               yylloc.first_column;
          (((CIdExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.lastLine =
               yylloc.last_line;
          (((CIdExp *)yyloc._8_8_)->super_IExpression).super_PositionedNode.position.lastColumn =
               yylloc.last_column;
        }
        lVar8 = yylsa[199]._8_8_ + (long)iVar7 * -8;
        yyvsa[199].Program = yyvsa[199].Program - (long)iVar7;
        yylsa[199]._8_8_ = lVar8 + 8;
        *(undefined8 *)(lVar8 + 8) = yyloc._8_8_;
        YVar5._4_4_ = iStack_13fc;
        YVar5._0_4_ = iStack_1400;
        _yyresult[(long)iVar7 * -2 + 2] = YVar5;
        YVar6._4_4_ = yyloc.first_column;
        YVar6._0_4_ = yyloc.first_line;
        _yyresult[(long)iVar7 * -2 + 3] = YVar6;
        yyctx.yylloc._4_4_ = ""[yytoken] + -0x2d;
        yyctx.yylloc._0_4_ = (int)yypgoto[yyctx.yylloc._4_4_] + (uint)(byte)*yyvsa[199].string;
        if ((((int)yyctx.yylloc < 0) || (0x144 < (int)yyctx.yylloc)) ||
           (yycheck[(int)yyctx.yylloc] != (ushort)(byte)*yyvsa[199].string)) {
          local_1709 = ""[yyctx.yylloc._4_4_];
        }
        else {
          local_1709 = yytable[(int)yyctx.yylloc];
        }
        yystacksize._4_4_ = (uint)local_1709;
        _yyresult = _yyresult + (long)iVar7 * -2 + 2;
      }
    }
    else {
      if (yychar == -2) {
        yychar = yylex();
      }
      if (0 < yychar) {
        if (yychar != 0x100) {
          if ((yychar < 0) || (299 < yychar)) {
            local_1580 = 2;
          }
          else {
            local_1580 = (int)""[yychar];
          }
          yyval._4_4_ = local_1580;
          goto LAB_001cbefb;
        }
        yychar = 0x101;
        yyerror_range[0].last_column = yylloc.first_column;
        yyerror_range[0].last_line = yylloc.first_line;
        goto LAB_001cdb4b;
      }
      yychar = 0;
      yyval._4_4_ = 0;
LAB_001cbefb:
      iVar7 = yyval._4_4_ + (int)sVar2;
      if (((iVar7 < 0) || (0x144 < iVar7)) || ((int)yycheck[iVar7] != yyval._4_4_))
      goto LAB_001cbfe8;
      yystacksize._4_4_ = (uint)yytable[iVar7];
      if (yystacksize._4_4_ == 0) {
        yytoken = YYSYMBOL_YYEOF;
        goto LAB_001cc00d;
      }
      if ((int)yystacksize != 0) {
        yystacksize._0_4_ = (int)yystacksize + -1;
      }
      *(YYSTYPE *)(yylsa[199]._8_8_ + 8) = yylval;
      YVar3._4_4_ = yylloc.first_column;
      YVar3._0_4_ = yylloc.first_line;
      yylsa[199]._8_8_ = yylsa[199]._8_8_ + 8;
      _yyresult[2] = YVar3;
      YVar4._4_4_ = yylloc.last_column;
      YVar4._0_4_ = yylloc.last_line;
      _yyresult[3] = YVar4;
      yychar = -2;
      _yyresult = _yyresult + 2;
    }
  }
  __n = (long)yyvsa[199].Program + (1 - (long)yyssp);
  if ((long)yyssa._192_8_ < 10000) {
    yyssa._192_8_ = yyssa._192_8_ << 1;
    if (10000 < (long)yyssa._192_8_) {
      yyssa[0xc0] = '\x10';
      yyssa[0xc1] = '\'';
      yyssa[0xc2] = '\0';
      yyssa[0xc3] = '\0';
      yyssa[0xc4] = '\0';
      yyssa[0xc5] = '\0';
      yyssa[0xc6] = '\0';
      yyssa[199] = '\0';
    }
    __dest = (yy_state_t *)malloc(yyssa._192_8_ * 0x19 + 0x1e);
    if (__dest != (yy_state_t *)0x0) {
      memcpy(__dest,yyssp,__n);
      __dest_00 = (YYSTYPE *)(__dest + ((yyssa._192_8_ + 0xf) / 0x10) * 0x10);
      memcpy(__dest_00,yyvsp,__n * 8);
      __dest_01 = __dest_00 + ((yyssa._192_8_ * 8 + 0xf) / 0x10) * 2;
      memcpy(__dest_01,yylsp,__n * 0x10);
      if ((yy_state_t **)yyssp != &yyss) {
        free(yyssp);
      }
      yyvsa[199].Program = (CProgram *)(__dest + (__n - 1));
      yylsa[199]._8_8_ = __dest_00 + (__n - 1);
      _yyresult = __dest_01 + __n * 2 + -2;
      yylsp = (YYLTYPE *)__dest_01;
      yyvsp = __dest_00;
      yyssp = __dest;
      if (yyvsa[199].Program < (CProgram *)(__dest + yyssa._192_8_ + -1)) goto LAB_001cbe09;
LAB_001cdd24:
      local_13e0 = 1;
LAB_001cdd4a:
      if (yychar != -2) {
        if ((yychar < 0) || (299 < yychar)) {
          local_1718 = YYSYMBOL_YYUNDEF;
        }
        else {
          local_1718 = (yysymbol_kind_t)""[yychar];
        }
        yydestruct("Cleanup: discarding lookahead",local_1718,&yylval,&yylloc,program);
      }
      for (; yyvsa[199].Program != (CProgram *)yyssp;
          yyvsa[199] = (YYSTYPE)((long)&yyvsa[199].Program[-1].classList._M_t.
                                        super___uniq_ptr_impl<CClassList,_std::default_delete<CClassList>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_CClassList_*,_std::default_delete<CClassList>_>
                                        .super__Head_base<0UL,_CClassList_*,_false>._M_head_impl + 7
                                )) {
        yydestruct("Cleanup: popping",(int)""[(int)(uint)(byte)*yyvsa[199].string],
                   (YYSTYPE *)yylsa[199]._8_8_,(YYLTYPE *)_yyresult,program);
        yylsa[199]._8_8_ = yylsa[199]._8_8_ + -8;
        _yyresult = _yyresult + -2;
      }
      if ((yy_state_t **)yyssp != &yyss) {
        free(yyssp);
      }
      if ((char **)yymsg_alloc != &yymsg) {
        free((void *)yymsg_alloc);
      }
      return local_13e0;
    }
  }
LAB_001cdd30:
  yyerror(program,"memory exhausted");
  local_13e0 = 2;
  goto LAB_001cdd4a;
}

Assistant:

int
yyparse (CProgram** program)
{
    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

    /* The location stack: array, bottom, top.  */
    YYLTYPE yylsa[YYINITDEPTH];
    YYLTYPE *yyls = yylsa;
    YYLTYPE *yylsp = yyls;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;
  YYLTYPE yyloc;

  /* The locations where the error started and ended.  */
  YYLTYPE yyerror_range[3];

  /* Buffer for error messages, and its allocated size.  */
  char yymsgbuf[128];
  char *yymsg = yymsgbuf;
  YYPTRDIFF_T yymsg_alloc = sizeof yymsgbuf;

#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N), yylsp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = YYEMPTY; /* Cause a token to be read.  */

  yylsp[0] = yylloc;
  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    YYNOMEM;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;
        YYLTYPE *yyls1 = yyls;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yyls1, yysize * YYSIZEOF (*yylsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
        yyls = yyls1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        YYNOMEM;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          YYNOMEM;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
        YYSTACK_RELOCATE (yyls_alloc, yyls);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;
      yylsp = yyls + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */


  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == YYEMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex ();
    }

  if (yychar <= YYEOF)
    {
      yychar = YYEOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == YYerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = YYUNDEF;
      yytoken = YYSYMBOL_YYerror;
      yyerror_range[1] = yylloc;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END
  *++yylsp = yylloc;

  /* Discard the shifted token.  */
  yychar = YYEMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];

  /* Default location. */
  YYLLOC_DEFAULT (yyloc, (yylsp - yylen), yylen);
  yyerror_range[1] = yyloc;
  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 2: /* Program: MainClass ClassDeclarationList  */
#line 124 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                       { 
		*program = (yyval.Program) = new CProgram( (yyvsp[-1].MainClass), (yyvsp[0].ClassDeclarationList) );
	}
#line 1649 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 3: /* MainClass: CLASS Identifier LBRACE MainMethod RBRACE  */
#line 133 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
        {	
		(yyval.MainClass) = new CMainClass( (yyvsp[-3].Identifier), (yyvsp[-1].MainMethod) );
	}
#line 1657 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 4: /* MainMethod: PUBLIC STATIC VOID MAIN LPAREN STRING LBRACKET RBRACKET Identifier RPAREN LBRACE VarDeclarationList StatementList RBRACE  */
#line 144 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
        {	
		(yyval.MainMethod) = new CMainMethod( 0, (yyvsp[-5].Identifier), (CFieldList *) (yyvsp[-2].VarDeclarationList),(CCompoundStm *)(yyvsp[-1].Statement) );
	}
#line 1665 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 5: /* ClassDeclarationList: %empty  */
#line 150 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.ClassDeclarationList) = new CClassList();
	}
#line 1673 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 6: /* ClassDeclarationList: ClassDeclarationList Class  */
#line 154 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                   { (yyval.ClassDeclarationList) = (yyvsp[-1].ClassDeclarationList); (yyvsp[-1].ClassDeclarationList)->Add((yyvsp[0].Class)); }
#line 1679 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 7: /* Class: CLASS Identifier LBRACE VarDeclarationList MethodDeclarationList RBRACE  */
#line 161 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.Class) = new CClass( (yyvsp[-4].Identifier), 0, (yyvsp[-2].VarDeclarationList), (yyvsp[-1].MethodDeclarationList) );
	}
#line 1687 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 8: /* Class: CLASS Identifier EXTENDS Identifier LBRACE VarDeclarationList MethodDeclarationList RBRACE  */
#line 168 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.Class) = new CClass( (yyvsp[-6].Identifier), (yyvsp[-4].Identifier), (yyvsp[-2].VarDeclarationList), (yyvsp[-1].MethodDeclarationList) );
	}
#line 1695 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 9: /* MethodDeclaration: PUBLIC Type Identifier LPAREN ArgumentList RPAREN LBRACE VarDeclarationList StatementList RETURN Expression SEMI RBRACE  */
#line 180 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
        { 
		(yyval.MethodDeclaration) = new CMethod( (yyvsp[-11].Type), (yyvsp[-2].Expression), (yyvsp[-10].Identifier), (yyvsp[-8].ArgumentList), (CFieldList *)(yyvsp[-5].VarDeclarationList),(CCompoundStm *)(yyvsp[-4].Statement), true );
	}
#line 1703 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 10: /* MethodDeclaration: PRIVATE Type Identifier LPAREN ArgumentList RPAREN LBRACE VarDeclarationList StatementList RETURN Expression SEMI RBRACE  */
#line 190 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
        { 
		(yyval.MethodDeclaration) = new CMethod( (yyvsp[-11].Type), (yyvsp[-2].Expression), (yyvsp[-10].Identifier), (yyvsp[-8].ArgumentList), (CFieldList *)(yyvsp[-5].VarDeclarationList), (CCompoundStm *)(yyvsp[-4].Statement), false );
	}
#line 1711 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 11: /* MethodDeclarationList: %empty  */
#line 196 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.MethodDeclarationList) = new CMethodList();
	}
#line 1719 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 12: /* MethodDeclarationList: MethodDeclarationList MethodDeclaration  */
#line 200 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                { 
		(yyval.MethodDeclarationList) = (yyvsp[-1].MethodDeclarationList); (yyvsp[-1].MethodDeclarationList)->Add((yyvsp[0].MethodDeclaration));
	}
#line 1727 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 13: /* VarDeclaration: Type Identifier SEMI  */
#line 206 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                             {
	    (yyvsp[-1].Identifier)->isInstance = true;
		(yyval.VarDeclaration) = new CField( (yyvsp[-2].Type), (yyvsp[-1].Identifier) );
	}
#line 1736 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 14: /* VarDeclarationList: %empty  */
#line 213 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.VarDeclarationList) = new CFieldList();
	}
#line 1744 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 15: /* VarDeclarationList: VarDeclarationList VarDeclaration  */
#line 217 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                          {
		(yyval.VarDeclarationList) = (yyvsp[-1].VarDeclarationList); (yyvsp[-1].VarDeclarationList)->Add( (yyvsp[0].VarDeclaration) );
	}
#line 1752 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 16: /* Argument: Type Identifier  */
#line 223 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                        {
	    (yyvsp[0].Identifier)->isInstance = true;
		(yyval.Argument) = new CArgument( (yyvsp[-1].Type), (yyvsp[0].Identifier) );
	}
#line 1761 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 17: /* Type: INT_ARRAY  */
#line 230 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                  { 
		auto p = (yyval.Type) = new CType( enums::TPrimitiveType::INT_ARRAY );
		SAVE_LOCATION
	}
#line 1770 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 18: /* Type: BOOLEAN  */
#line 235 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                { 
	    auto p = (yyval.Type) = new CType( enums::TPrimitiveType::BOOLEAN );
		SAVE_LOCATION
	}
#line 1779 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 19: /* Type: INT  */
#line 240 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
            { 
		auto p = (yyval.Type) = new CType( enums::TPrimitiveType::INT );
		SAVE_LOCATION
	}
#line 1788 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 20: /* Type: Identifier  */
#line 245 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                   { (yyval.Type) = new CType( (yyvsp[0].Identifier) ); }
#line 1794 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 21: /* NonEmptyArgumentList: Argument  */
#line 248 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                 { (yyval.NonEmptyArgumentList) = new CArgumentList((yyvsp[0].Argument)); }
#line 1800 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 22: /* NonEmptyArgumentList: NonEmptyArgumentList COMMA Argument  */
#line 250 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                            { (yyval.NonEmptyArgumentList) = (yyvsp[-2].NonEmptyArgumentList); (yyvsp[-2].NonEmptyArgumentList)->Add((yyvsp[0].Argument)); }
#line 1806 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 23: /* ArgumentList: %empty  */
#line 254 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { (yyval.ArgumentList) = new CArgumentList(); }
#line 1812 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 24: /* ArgumentList: NonEmptyArgumentList  */
#line 256 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                             { (yyval.ArgumentList) = (yyvsp[0].NonEmptyArgumentList); }
#line 1818 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 25: /* StatementList: %empty  */
#line 260 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               {(yyval.Statement) = new CCompoundStm( 0, 0 ); }
#line 1824 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 26: /* StatementList: Statement StatementList  */
#line 262 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                { (yyval.Statement) = new CCompoundStm((yyvsp[-1].Statement), (yyvsp[0].Statement));  }
#line 1830 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 27: /* Statement: LBRACE StatementList RBRACE  */
#line 266 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                    { (yyval.Statement) = (yyvsp[-1].Statement); }
#line 1836 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 28: /* Statement: IF LPAREN Expression RPAREN Statement ELSE Statement  */
#line 268 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                             { (yyval.Statement) = new CIfStm( (yyvsp[-4].Expression), (yyvsp[-2].Statement), (yyvsp[0].Statement) );  }
#line 1842 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 29: /* Statement: WHILE LPAREN Expression RPAREN Statement  */
#line 270 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                 { (yyval.Statement) = new CWhileStm( (yyvsp[-2].Expression), (yyvsp[0].Statement) );  }
#line 1848 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 30: /* Statement: PRINTLN LPAREN Expression RPAREN SEMI  */
#line 272 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                              { (yyval.Statement) = new CPrintStm( (yyvsp[-2].Expression) ); }
#line 1854 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 31: /* Statement: Identifier ASSIGN Expression SEMI  */
#line 274 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                          { (yyvsp[-3].Identifier)->isInstance = true; (yyval.Statement) = new CAssignStm( (yyvsp[-3].Identifier), (yyvsp[-1].Expression) );  }
#line 1860 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 32: /* Statement: Identifier LBRACKET Expression RBRACKET ASSIGN Expression SEMI  */
#line 276 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                                       { (yyvsp[-6].Identifier)->isInstance = true; (yyval.Statement) = new CAssignSubscriptStm( (yyvsp[-6].Identifier), (yyvsp[-4].Expression), (yyvsp[-1].Expression) );  }
#line 1866 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 33: /* Expression: Expression PLUS Expression  */
#line 280 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                   { (yyval.Expression) = new COpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TOperation::PLUS );  }
#line 1872 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 34: /* Expression: Expression MINUS Expression  */
#line 282 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                    { (yyval.Expression) = new COpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TOperation::MINUS );  }
#line 1878 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 35: /* Expression: Expression TIMES Expression  */
#line 284 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                    { (yyval.Expression) = new COpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TOperation::MULTIPLY );  }
#line 1884 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 36: /* Expression: Expression AND Expression  */
#line 286 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                  { (yyval.Expression) = new CLogOpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TLogicalOperation::AND );  }
#line 1890 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 37: /* Expression: Expression OR Expression  */
#line 288 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                 { (yyval.Expression) = new CLogOpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TLogicalOperation::OR );  }
#line 1896 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 38: /* Expression: Expression LESS Expression  */
#line 290 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                   { (yyval.Expression) = new CCompExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TCompareOperation::LESS );  }
#line 1902 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 39: /* Expression: Expression GREATER Expression  */
#line 292 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                      { (yyval.Expression) = new CCompExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TCompareOperation::GREATER );  }
#line 1908 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 40: /* Expression: Expression MOD Expression  */
#line 294 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                  { (yyval.Expression) = new COpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TOperation::MOD );  }
#line 1914 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 41: /* Expression: Expression LBRACKET Expression RBRACKET  */
#line 296 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                { (yyval.Expression) = new CByIndexExpression((yyvsp[-3].Expression), (yyvsp[-1].Expression));  }
#line 1920 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 42: /* Expression: Expression DOT LENGTH  */
#line 298 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                              { (yyval.Expression) = new CGetLengthExp( (yyvsp[-2].Expression) );  }
#line 1926 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 43: /* Expression: Expression DOT Identifier LPAREN ExpressionList RPAREN  */
#line 300 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                               { (yyval.Expression) = new CCallMethodExp( (yyvsp[-5].Expression), (yyvsp[-3].Identifier), (CExpList*) (yyvsp[-1].ExpressionList)) ;  }
#line 1932 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 44: /* Expression: Expression DOT Identifier  */
#line 302 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                  { (yyvsp[0].Identifier)->isInstance = true; (yyval.Expression) = new CGetFieldByThisExpression( (yyvsp[0].Identifier) ); }
#line 1938 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 45: /* Expression: MINUS Expression  */
#line 304 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                         { (yyval.Expression) = new CUnarMinusExp( (yyvsp[0].Expression) ); }
#line 1944 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 46: /* Expression: NUM  */
#line 306 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
            { auto p = (yyval.Expression) = new CNumExp((yyvsp[0].string)); SAVE_LOCATION }
#line 1950 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 47: /* Expression: TRUE  */
#line 308 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
             { auto p = (yyval.Expression) = new CLogExp(true); SAVE_LOCATION }
#line 1956 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 48: /* Expression: FALSE  */
#line 310 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
              { auto p = (yyval.Expression) = new CLogExp(false); SAVE_LOCATION }
#line 1962 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 49: /* Expression: Identifier  */
#line 312 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                   { (yyvsp[0].Identifier)->isInstance = true; (yyval.Expression) = (yyvsp[0].Identifier); }
#line 1968 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 50: /* Expression: NEW INT LBRACKET Expression RBRACKET  */
#line 314 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                             { (yyval.Expression) = new CNewArrayExpression((yyvsp[-1].Expression));  }
#line 1974 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 51: /* Expression: NEW Identifier LPAREN RPAREN  */
#line 316 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                      { (yyval.Expression) = new CNewIdentifier( (yyvsp[-2].Identifier) );  }
#line 1980 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 52: /* Expression: LPAREN Expression RPAREN  */
#line 318 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                 { (yyval.Expression) = (yyvsp[-1].Expression); }
#line 1986 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 53: /* Expression: THIS  */
#line 320 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
             { auto p = (yyval.Expression) = new CThisExpression(); SAVE_LOCATION }
#line 1992 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 54: /* Expression: NOT Expression  */
#line 322 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                       { (yyval.Expression) = new CNegativeExpression((yyvsp[0].Expression));  }
#line 1998 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 55: /* NonEmptyExpressionList: Expression  */
#line 326 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                   { (yyval.NonEmptyExpressionList) = new CExpList((yyvsp[0].Expression));  }
#line 2004 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 56: /* NonEmptyExpressionList: NonEmptyExpressionList COMMA Expression  */
#line 328 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                { (yyval.NonEmptyExpressionList) = (yyvsp[-2].NonEmptyExpressionList); (yyvsp[-2].NonEmptyExpressionList)->Add((yyvsp[0].Expression)); }
#line 2010 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 57: /* ExpressionList: %empty  */
#line 332 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { (yyval.ExpressionList) = new CExpList();  }
#line 2016 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 58: /* ExpressionList: NonEmptyExpressionList  */
#line 334 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                               { (yyval.ExpressionList) = (yyvsp[0].NonEmptyExpressionList); }
#line 2022 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 59: /* Identifier: ID  */
#line 338 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
           { auto p = (yyval.Identifier) = new CIdExp( (yyvsp[0].string) ); SAVE_LOCATION }
#line 2028 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;


#line 2032 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"

      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;
  *++yylsp = yyloc;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == YYEMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      {
        yypcontext_t yyctx
          = {yyssp, yytoken, &yylloc};
        char const *yymsgp = YY_("syntax error");
        int yysyntax_error_status;
        yysyntax_error_status = yysyntax_error (&yymsg_alloc, &yymsg, &yyctx);
        if (yysyntax_error_status == 0)
          yymsgp = yymsg;
        else if (yysyntax_error_status == -1)
          {
            if (yymsg != yymsgbuf)
              YYSTACK_FREE (yymsg);
            yymsg = YY_CAST (char *,
                             YYSTACK_ALLOC (YY_CAST (YYSIZE_T, yymsg_alloc)));
            if (yymsg)
              {
                yysyntax_error_status
                  = yysyntax_error (&yymsg_alloc, &yymsg, &yyctx);
                yymsgp = yymsg;
              }
            else
              {
                yymsg = yymsgbuf;
                yymsg_alloc = sizeof yymsgbuf;
                yysyntax_error_status = YYENOMEM;
              }
          }
        yyerror (program, yymsgp);
        if (yysyntax_error_status == YYENOMEM)
          YYNOMEM;
      }
    }

  yyerror_range[1] = yylloc;
  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= YYEOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == YYEOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval, &yylloc, program);
          yychar = YYEMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;
  ++yynerrs;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;

      yyerror_range[1] = *yylsp;
      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp, yylsp, program);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  yyerror_range[2] = yylloc;
  ++yylsp;
  YYLLOC_DEFAULT (*yylsp, yyerror_range, 2);

  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturnlab;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturnlab;


/*-----------------------------------------------------------.
| yyexhaustedlab -- YYNOMEM (memory exhaustion) comes here.  |
`-----------------------------------------------------------*/
yyexhaustedlab:
  yyerror (program, YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturnlab;


/*----------------------------------------------------------.
| yyreturnlab -- parsing is finished, clean up and return.  |
`----------------------------------------------------------*/
yyreturnlab:
  if (yychar != YYEMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval, &yylloc, program);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp, yylsp, program);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif
  if (yymsg != yymsgbuf)
    YYSTACK_FREE (yymsg);
  return yyresult;
}